

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O0

string * join_as_strings<ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>>
                   (string *__return_storage_ptr__,
                   drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
                   *range,string_view separator)

{
  basic_string_view<char,_std::char_traits<char>_> *separator_00;
  range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
  local_58;
  drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
  *local_28;
  drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
  *range_local;
  string_view separator_local;
  
  separator_00 = (basic_string_view<char,_std::char_traits<char>_> *)separator._M_str;
  range_local = (drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
                 *)separator._M_len;
  local_28 = range;
  separator_local._M_len = (size_t)separator_00;
  separator_local._M_str = (char *)__return_storage_ptr__;
  ezy::
  transform<ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>,ezy::to_string_fn_const&>
            ((result_range_type_conflict7 *)&local_58,(ezy *)range,
             (drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>
              *)&ezy::cpo::to_string,(to_string_fn *)separator_00);
  ezy::
  join<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,std::vector<int,std::allocator<int>>>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
            (__return_storage_ptr__,(ezy *)&local_58,
             (range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
              *)&range_local,separator_00);
  ezy::detail::
  range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::drop_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_std::vector<int,_std::allocator<int>_>_>_>_>,_const_ezy::to_string_fn_&>
  ::~range_view(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}